

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O0

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  SDKConnection *in_RDI;
  uint32_t remoteTS23;
  int i;
  uint8_t pong_message [12];
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_2c;
  undefined1 local_28 [40];
  
  if ((in_ESI == 0x33) && (in_ECX == 9)) {
    local_28[0] = 0x4e;
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      local_28[local_2c + 1] = *(undefined1 *)(in_RDX + (local_2c + 1));
    }
    tonk_time();
    tonk::SDKConnection::ToRemoteTime23
              (in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    tonk::WriteU24_LE((uint8_t *)in_RDI,in_stack_ffffffffffffffbc);
    tonk::SDKConnection::Send
              ((SDKConnection *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI
               ,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  }
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_Reliable1 && bytes == 9)
    {
        uint8_t pong_message[1 + 8 + 3];
        pong_message[0] = 78;
        for (int i = 0; i < 8; ++i) {
            pong_message[i + 1] = data[i + 1];
        }
        uint32_t remoteTS23 = ToRemoteTime23(tonk_time());
        tonk::WriteU24_LE(pong_message + 1 + 8, remoteTS23);
        Send(pong_message, 1 + 8 + 3, channel);
    }
}